

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint auto_choose_color_from_profile
               (LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorProfile *prof)

{
  uchar **ppuVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  LodePNGColorType LVar6;
  LodePNGColorType LVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = prof->numpixels;
  uVar3 = prof->key;
  uVar4 = prof->bits;
  uVar5 = 8;
  if (8 < uVar4) {
    uVar5 = uVar4;
  }
  uVar2 = prof->alpha;
  if (uVar9 >= 0x11 || uVar3 == 0) {
    uVar5 = uVar4;
  }
  mode_out->key_defined = 0;
  uVar4 = prof->numcolors;
  uVar8 = 1;
  if ((2 < (ulong)uVar4) && (uVar8 = 2, 4 < uVar4)) {
    uVar8 = (uint)(0x10 < uVar4) * 4 + 4;
  }
  if (((uVar9 < (ulong)uVar4 * 2 || 0x100 < uVar4) || 8 < uVar5) ||
      uVar5 <= uVar8 && prof->colored == 0) {
    bVar10 = prof->colored != 0;
    mode_out->bitdepth = uVar5;
    LVar6 = bVar10 + 4 + (uint)bVar10;
    LVar7 = (uint)bVar10 * 2;
    if (uVar2 != 0) {
      LVar7 = LVar6;
    }
    if (uVar9 < 0x11 && uVar3 != 0) {
      LVar7 = LVar6;
    }
    mode_out->colortype = LVar7;
    uVar4 = 0;
    if (uVar3 != 0 && 0x10 < uVar9) {
      uVar3 = ~(-1 << ((byte)uVar5 & 0x1f));
      mode_out->key_r = prof->key_r & uVar3;
      mode_out->key_g = prof->key_g & uVar3;
      mode_out->key_b = prof->key_b & uVar3;
      mode_out->key_defined = 1;
      uVar4 = 0;
    }
  }
  else {
    ppuVar1 = &mode_out->palette;
    if (mode_out->palette != (uchar *)0x0) {
      free(mode_out->palette);
    }
    *ppuVar1 = (uchar *)0x0;
    mode_out->palettesize = 0;
    if (prof->numcolors == 0) {
      uVar4 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar4 = lodepng_palette_add(mode_out,prof->palette[uVar9 * 4],prof->palette[uVar9 * 4 + 1],
                                    prof->palette[uVar9 * 4 + 2],prof->palette[uVar9 * 4 + 3]);
        if (uVar4 != 0) goto LAB_001093b0;
        uVar9 = uVar9 + 1;
      } while (uVar9 != prof->numcolors);
      uVar4 = 0;
    }
LAB_001093b0:
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar8;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar8)) {
      if (*ppuVar1 != (uchar *)0x0) {
        free(*ppuVar1);
      }
      *ppuVar1 = (uchar *)0x0;
      mode_out->palettesize = 0;
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  return uVar4;
}

Assistant:

static unsigned auto_choose_color_from_profile(LodePNGColorMode* mode_out,
                                               const LodePNGColorMode* mode_in,
                                               const LodePNGColorProfile* prof)
{
  unsigned error = 0;
  unsigned palettebits, palette_ok;
  size_t i, n;
  size_t numpixels = prof->numpixels;

  unsigned alpha = prof->alpha;
  unsigned key = prof->key;
  unsigned bits = prof->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16)
  {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  n = prof->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8;
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(!prof->colored && bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    const unsigned char* p = prof->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof->numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (prof->colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                : (prof->colored ? LCT_RGB : LCT_GREY);

    if(key)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof->key_r & mask;
      mode_out->key_g = prof->key_g & mask;
      mode_out->key_b = prof->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}